

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O3

void nes_set_mute_mask_mame(void *chip,UINT32 MuteMask)

{
  nesapu_set_mute_mask(*(void **)((long)chip + 8),MuteMask);
  if (*(void **)((long)chip + 0x18) != (void *)0x0) {
    NES_FDS_SetMask(*(void **)((long)chip + 0x18),MuteMask >> 5 & 1);
    return;
  }
  return;
}

Assistant:

static void nes_set_mute_mask_mame(void* chip, UINT32 MuteMask)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	nesapu_set_mute_mask(info->chip_apu, MuteMask);
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		NES_FDS_SetMask(info->chip_fds, (MuteMask & 0x20) >> 5);
#endif
	
	return;
}